

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

int os_file_stat(char *fname,int follow_links,os_file_stat_t *s)

{
  int iVar1;
  __uid_t _Var2;
  int iVar3;
  __gid_t _Var4;
  char *pcVar5;
  __gid_t *__s;
  ulong uVar6;
  int iVar7;
  stat buf;
  stat local_c0;
  
  if (follow_links == 0) {
    iVar1 = lstat(fname,&local_c0);
  }
  else {
    iVar1 = stat(fname,&local_c0);
  }
  iVar7 = 0;
  if (iVar1 == 0) {
    s->sizelo = (undefined4)local_c0.st_size;
    s->sizehi = local_c0.st_size._4_4_;
    s->cre_time = local_c0.st_ctim.tv_sec;
    s->mod_time = local_c0.st_mtim.tv_sec;
    s->acc_time = local_c0.st_atim.tv_sec;
    s->mode = (ulong)local_c0.st_mode;
    s->attrs = 0;
    pcVar5 = os_get_root_name(fname);
    if (*pcVar5 == '.') {
      *(byte *)&s->attrs = (byte)s->attrs | 1;
    }
    _Var2 = geteuid();
    if (_Var2 == local_c0.st_uid) {
      if ((local_c0.st_mode >> 8 & 1) != 0) {
        *(byte *)&s->attrs = (byte)s->attrs | 4;
      }
      iVar7 = 1;
      if ((char)local_c0.st_mode < '\0') {
        *(byte *)&s->attrs = (byte)s->attrs | 8;
      }
    }
    else {
      iVar7 = 0;
      iVar1 = getgroups(0,(__gid_t *)0x0);
      if (0xfffefffe < iVar1 - 0x10000U) {
        uVar6 = (ulong)(iVar1 + 1) * 4;
        __s = (__gid_t *)operator_new__(uVar6);
        iVar7 = 0;
        memset(__s,0,uVar6);
        iVar3 = getgroups(iVar1,__s + 1);
        if (-1 < iVar3) {
          _Var4 = getegid();
          *__s = _Var4;
          if (-1 < iVar1) {
            uVar6 = 0;
            do {
              if (local_c0.st_gid == __s[uVar6]) {
                if ((local_c0.st_mode & 0x20) != 0) {
                  *(byte *)&s->attrs = (byte)s->attrs | 4;
                }
                iVar7 = 1;
                if ((local_c0.st_mode & 0x10) == 0) goto LAB_001cfd60;
                goto LAB_001cfd56;
              }
              uVar6 = uVar6 + 1;
            } while (iVar1 + 1 != uVar6);
          }
          if ((local_c0.st_mode & 4) != 0) {
            *(byte *)&s->attrs = (byte)s->attrs | 4;
          }
          iVar7 = 1;
          if ((local_c0.st_mode & 2) != 0) {
LAB_001cfd56:
            *(byte *)&s->attrs = (byte)s->attrs | 8;
            iVar7 = 1;
          }
        }
LAB_001cfd60:
        operator_delete__(__s);
      }
    }
  }
  return iVar7;
}

Assistant:

int
os_file_stat( const char *fname, int follow_links, os_file_stat_t *s )
{
    struct stat buf;
    if ((follow_links ? stat(fname, &buf) : lstat(fname, &buf)) != 0)
        return false;

    s->sizelo = (uint32_t)(buf.st_size & 0xFFFFFFFF);
    s->sizehi = sizeof(buf.st_size) > 4
                ? (uint32_t)((buf.st_size >> 32) & 0xFFFFFFFF)
                : 0;
    s->cre_time = buf.st_ctime;
    s->mod_time = buf.st_mtime;
    s->acc_time = buf.st_atime;
    s->mode = buf.st_mode;
    s->attrs = 0;

    if (os_get_root_name(fname)[0] == '.') {
        s->attrs |= OSFATTR_HIDDEN;
    }

    // If we're the owner, check if we have read/write access.
    if (geteuid() == buf.st_uid) {
        if (buf.st_mode & S_IRUSR)
            s->attrs |= OSFATTR_READ;
        if (buf.st_mode & S_IWUSR)
            s->attrs |= OSFATTR_WRITE;
        return true;
    }

    // Check if one of our groups matches the file's group and if so, check
    // for read/write access.

    // Also reserve a spot for the effective group ID, which might
    // not be included in the list in our next call.
    int grpSize = getgroups(0, NULL) + 1;
    // Paranoia.
    if (grpSize > NGROUPS_MAX or grpSize < 0)
        return false;

    const auto groups = std::make_unique<gid_t[]>(grpSize);
    if (getgroups(grpSize - 1, groups.get() + 1) < 0) {
        return false;
    }
    groups[0] = getegid();
    int i;
    for (i = 0; i < grpSize and buf.st_gid != groups[i]; ++i)
        ;
    if (i < grpSize) {
        if (buf.st_mode & S_IRGRP)
            s->attrs |= OSFATTR_READ;
        if (buf.st_mode & S_IWGRP)
            s->attrs |= OSFATTR_WRITE;
        return true;
    }

    // We're neither the owner of the file nor do we belong to its
    // group.  Check whether the file is world readable/writable.
    if (buf.st_mode & S_IROTH)
        s->attrs |= OSFATTR_READ;
    if (buf.st_mode & S_IWOTH)
        s->attrs |= OSFATTR_WRITE;
    return true;
}